

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildtexture.cpp
# Opt level: O0

BYTE * __thiscall FBuildTexture::GetColumn(FBuildTexture *this,uint column,Span **spans_out)

{
  Span **ppSVar1;
  Span **spans_out_local;
  uint column_local;
  FBuildTexture *this_local;
  
  spans_out_local._4_4_ = column;
  if ((this->super_FTexture).Width <= column) {
    if ((this->super_FTexture).WidthMask + 1 == (uint)(this->super_FTexture).Width) {
      spans_out_local._4_4_ = (this->super_FTexture).WidthMask & column;
    }
    else {
      spans_out_local._4_4_ = column % (uint)(this->super_FTexture).Width;
    }
  }
  if (spans_out != (Span **)0x0) {
    if (this->Spans == (Span **)0x0) {
      ppSVar1 = FTexture::CreateSpans(&this->super_FTexture,this->Pixels);
      this->Spans = ppSVar1;
    }
    *spans_out = this->Spans[spans_out_local._4_4_];
  }
  return this->Pixels + spans_out_local._4_4_ * (this->super_FTexture).Height;
}

Assistant:

const BYTE *FBuildTexture::GetColumn (unsigned int column, const Span **spans_out)
{
	if (column >= Width)
	{
		if (WidthMask + 1 == Width)
		{
			column &= WidthMask;
		}
		else
		{
			column %= Width;
		}
	}
	if (spans_out != NULL)
	{
		if (Spans == NULL)
		{
			Spans = CreateSpans (Pixels);
		}
		*spans_out = Spans[column];
	}
	return Pixels + column*Height;
}